

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlmidi_cvt.hpp
# Opt level: O3

void cvt_FMIns_to_ADLI(ADL_Instrument *ins,OplInstMeta *in)

{
  double dVar1;
  byte bVar2;
  ADL_UInt8 AVar3;
  undefined4 uVar4;
  uint16_t uVar5;
  ADL_UInt8 *pAVar6;
  ulong uVar7;
  uint uVar8;
  
  ins->second_voice_detune = '\0';
  dVar1 = in->voice2_fine_tune;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    ins->second_voice_detune = (char)(int)(dVar1 * 32.0) * '\x02';
  }
  ins->midi_velocity_offset = in->midiVelocityOffset;
  ins->percussion_key_number = in->drumTone;
  bVar2 = in->flags;
  ins->inst_flags = bVar2 * '\x02' & 6 | bVar2 & 0x38 | (bVar2 & 5) != 0;
  pAVar6 = &ins->operators[0].waveform_E0;
  uVar7 = 0;
  do {
    uVar8 = (uint)uVar7 & 1;
    uVar4 = *(undefined4 *)((long)&in->op[1 < uVar7].modulator_E862 + ((ulong)(uVar8 * 4) ^ 4));
    AVar3 = *(ADL_UInt8 *)((long)&in->op[1 < uVar7].modulator_E862 + ((ulong)uVar8 ^ 9));
    *pAVar6 = (ADL_UInt8)((uint)uVar4 >> 0x18);
    pAVar6[-1] = (ADL_UInt8)((uint)uVar4 >> 0x10);
    pAVar6[-2] = (ADL_UInt8)((uint)uVar4 >> 8);
    ((ADL_Operator *)(pAVar6 + -4))->avekf_20 = (ADL_UInt8)uVar4;
    pAVar6[-3] = AVar3;
    uVar7 = uVar7 + 1;
    pAVar6 = pAVar6 + 5;
  } while (uVar7 != 4);
  ins->note_offset1 = (short)in->op[0].noteOffset;
  ins->fb_conn1_C0 = in->op[0].feedconn;
  ins->note_offset2 = (short)in->op[1].noteOffset;
  ins->fb_conn2_C0 = in->op[1].feedconn;
  uVar5 = in->soundKeyOffMs;
  ins->delay_on_ms = in->soundKeyOnMs;
  ins->delay_off_ms = uVar5;
  return;
}

Assistant:

static void cvt_FMIns_to_generic(WOPLI &ins, const OplInstMeta &in)
{
    ins.second_voice_detune = 0;
    double voice2_fine_tune = in.voice2_fine_tune;
    if(voice2_fine_tune != 0)
    {
        int m = (int)(voice2_fine_tune * 32.0);
        m += 64;
        m <<= 1;
        m -= 128;
        ins.second_voice_detune = (uint8_t)m;
    }

    ins.midi_velocity_offset = in.midiVelocityOffset;
    ins.percussion_key_number = in.drumTone;
    ins.inst_flags = (in.flags & (OplInstMeta::Flag_Pseudo4op|OplInstMeta::Flag_Real4op)) ? WOPL_Ins_4op : 0;
    ins.inst_flags|= (in.flags & OplInstMeta::Flag_Pseudo4op) ? WOPL_Ins_Pseudo4op : 0;
    ins.inst_flags|= (in.flags & OplInstMeta::Flag_NoSound) ? WOPL_Ins_IsBlank : 0;
    ins.inst_flags |= in.flags & OplInstMeta::Mask_RhythmMode;

    for(size_t op = 0; op < 4; op++)
    {
        const OplTimbre &in2op = in.op[(op < 2) ? 0 : 1];
        uint32_t regE862 = ((op & 1) == 0) ? in2op.carrier_E862 : in2op.modulator_E862;
        uint8_t reg40 = ((op & 1) == 0) ? in2op.carrier_40 : in2op.modulator_40;

        ins.operators[op].waveform_E0 = static_cast<uint8_t>(regE862 >> 24);
        ins.operators[op].susrel_80 = static_cast<uint8_t>(regE862 >> 16);
        ins.operators[op].atdec_60 = static_cast<uint8_t>(regE862 >> 8);
        ins.operators[op].avekf_20 = static_cast<uint8_t>(regE862 >> 0);
        ins.operators[op].ksl_l_40 = reg40;
    }

    ins.note_offset1 = in.op[0].noteOffset;
    ins.fb_conn1_C0 = in.op[0].feedconn;
    ins.note_offset2 = in.op[1].noteOffset;
    ins.fb_conn2_C0 = in.op[1].feedconn;

    ins.delay_on_ms = in.soundKeyOnMs;
    ins.delay_off_ms = in.soundKeyOffMs;
}